

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O2

void jhu::thrax::printRhs<true>(ostream *out,PhrasalRule *rule)

{
  Span SVar1;
  Span SVar2;
  AlignedSentencePair *pAVar3;
  pointer pbVar4;
  ostream *out_00;
  char *pcVar5;
  NT *pNVar6;
  Span SVar7;
  long lVar8;
  int iVar9;
  PhrasalRule *pPVar10;
  int in_R8D;
  NT *needle;
  string_view nt;
  short local_ac;
  Rhs nts;
  
  pAVar3 = rule->sentence;
  needle = nts._M_elems;
  pPVar10 = rule;
  pNVar6 = needle;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    pNVar6->span = (pPVar10->nts)._M_elems[0].span;
    pPVar10 = (PhrasalRule *)&(pPVar10->nts)._M_elems[0].label;
    pNVar6 = (NT *)&pNVar6->label;
  }
  pNVar6 = std::
           __find_if<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_pred<jhu::thrax::printRhs<true>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1_const&)_1_>>
                     (needle,&stack0xffffffffffffffd0);
  SVar1 = (rule->lhs).span.src;
  SVar7 = SVar1;
  do {
    SVar2 = (needle->span).src;
    do {
      while( true ) {
        iVar9 = (int)SVar7.start;
        if ((int)SVar1 >> 0x10 <= iVar9) {
          return;
        }
        if ((needle != pNVar6) && (local_ac = SVar2.start, local_ac <= SVar7.start)) break;
        if (SVar1.start != iVar9) {
          std::operator<<(out,' ');
        }
        pbVar4 = (pAVar3->src).
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,pbVar4[iVar9]._M_str,pbVar4[iVar9]._M_len);
        SVar7 = (Span)(iVar9 + 1);
      }
      if ((SVar1.start != iVar9) && ((int)SVar1 << 0x10 != (int)SVar2 << 0x10)) {
        std::operator<<(out,' ');
      }
      out_00 = (ostream *)(needle->label)._M_len;
      pcVar5 = (needle->label)._M_str;
      iVar9 = PhrasalRule::ntIndex(rule,needle);
      nt._M_str._0_4_ = iVar9;
      nt._M_len = (size_t)pcVar5;
      nt._M_str._4_4_ = 0;
      bracket((thrax *)out,out_00,nt,in_R8D);
      needle = needle + 1;
      SVar7 = (Span)((uint)SVar2 >> 0x10);
    } while (pNVar6 <= needle);
  } while( true );
}

Assistant:

inline void printRhs(std::ostream& out, const PhrasalRule& rule) {
  const auto& s = rule.sentence;
  constexpr auto empty = [](const auto& nt) { return nt.span.empty(); };
  auto nts = rule.nts;
  auto it = std::find_if(nts.begin(), nts.end(), empty);
  if constexpr (!SourceSide) {
    std::sort(
        nts.begin(),
        it,
        [](auto a, auto b) { return a.span.tgt.start < b.span.tgt.start; });
  }
  auto nt = nts.begin();
  auto [start, end] = rule.lhs.span.get<SourceSide>();
  auto [ntStart, ntEnd] = nt->span.get<SourceSide>();
  for (auto i = start; i < end; i++) {
    if (nt == it || i < ntStart) {
      if (i != start) {
        out << ' ';
      }
      if constexpr (SourceSide) {
        out << s.src[i];
      } else {
        out << s.tgt[i];
      }
    } else {
      if (i != start && ntStart != start) {
        out << ' ';
      }
      bracket(out, nt->label, rule.ntIndex(*nt));
      i = ntEnd - 1;
      nt++;
      if (nt < it) {
        auto [s, e] = nt->span.get<SourceSide>();
        ntStart = s;
        ntEnd = e;
      }
    }
  }
}